

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O1

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::load_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  Mapping *pMVar3;
  bool bVar4;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  undefined1 local_70 [32];
  bool local_50;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  pMVar3 = this->root_;
  _Var2._M_p = local_70 + 0x10;
  local_70._0_8_ = _Var2._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"framebuffers","");
  bVar4 = yaml::Mapping::hasKey(pMVar3,(string *)local_70);
  if ((pointer)local_70._0_8_ != _Var2._M_p) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (bVar4) {
    loadFramebuffers_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,this);
    bVar4 = local_50;
    if (local_50 == false) {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_70._0_8_,(pointer)(local_70._8_8_ + local_70._0_8_));
      paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar1;
      if (local_48 == &local_38) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             uStack_30;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_48;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             CONCAT71(uStack_37,local_38);
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_40;
      local_40 = 0;
      local_38 = '\0';
      __return_storage_ptr__->has_value_ = false;
      local_48 = &local_38;
    }
    if ((local_50 == false) && ((pointer)local_70._0_8_ != _Var2._M_p)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (bVar4 == false) {
      return __return_storage_ptr__;
    }
  }
  pMVar3 = this->root_;
  local_70._0_8_ = _Var2._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"textures","");
  bVar4 = yaml::Mapping::hasKey(pMVar3,(string *)local_70);
  if ((pointer)local_70._0_8_ != _Var2._M_p) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (bVar4) {
    loadTextures_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,this);
    bVar4 = local_50;
    if (local_50 == false) {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_70._0_8_,(pointer)(local_70._8_8_ + local_70._0_8_));
      paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar1;
      if (local_48 == &local_38) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             uStack_30;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_48;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             CONCAT71(uStack_37,local_38);
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_40;
      local_40 = 0;
      local_38 = '\0';
      __return_storage_ptr__->has_value_ = false;
      local_48 = &local_38;
    }
    if ((local_50 == false) && ((pointer)local_70._0_8_ != _Var2._M_p)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (bVar4 == false) {
      return __return_storage_ptr__;
    }
  }
  loadPrograms_abi_cxx11_
            ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_70,this);
  bVar4 = local_50;
  if (local_50 == false) {
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_70._0_8_,(pointer)(local_70._8_8_ + local_70._0_8_));
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_48 == &local_38) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           uStack_30;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_48;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           CONCAT71(uStack_37,local_38);
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_40;
    local_40 = 0;
    local_38 = '\0';
    __return_storage_ptr__->has_value_ = false;
    local_48 = &local_38;
  }
  if ((local_50 == false) && ((pointer)local_70._0_8_ != _Var2._M_p)) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (bVar4 != false) {
    loadCommands_abi_cxx11_
              ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,this);
    bVar4 = local_50;
    if (local_50 == false) {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_70._0_8_,(pointer)(local_70._8_8_ + local_70._0_8_));
      paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar1;
      if (local_48 == &local_38) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             uStack_30;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = local_48;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             CONCAT71(uStack_37,local_38);
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_40;
      local_40 = 0;
      local_38 = '\0';
      __return_storage_ptr__->has_value_ = false;
      local_48 = &local_38;
    }
    if ((local_50 == false) && ((pointer)local_70._0_8_ != _Var2._M_p)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (bVar4 != false) {
      __return_storage_ptr__->has_value_ = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> load() {
		if (root_.hasKey("framebuffers")) {
			auto result = loadFramebuffers();
			if (!result)
				return Unexpected(result.error());
		}

		if (root_.hasKey("textures")) {
			auto result = loadTextures();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadPrograms();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadCommands();
			if (!result)
				return Unexpected(result.error());
		}

		return Expected<void, std::string>();
	}